

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
do_call(Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
        *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Boxed_Value *pBVar1;
  Function_Params t_params;
  pair<bool,_bool> pVar2;
  guard_error *this_00;
  Type_Conversions_State *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Boxed_Value BVar4;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_50;
  pointer local_38;
  pointer local_30;
  
  pVar2 = Dynamic_Proxy_Function::call_match_internal
                    ((Dynamic_Proxy_Function *)params,(Function_Params *)t_conversions,in_RCX);
  if (((ushort)pVar2 & 1) == 0) {
    this_00 = (guard_error *)__cxa_allocate_exception(0x10);
    exception::guard_error::guard_error(this_00);
    __cxa_throw(this_00,&exception::guard_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar1 = params[6].m_end;
  if (((ushort)pVar2 >> 8 & 1) == 0) {
    (*(code *)pBVar1)(this,t_conversions);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    t_params.m_begin = *(Boxed_Value **)&t_conversions->m_conversions;
    t_params.m_end = *(Boxed_Value **)&t_conversions->m_saves;
    Param_Types::convert(&local_50,(Param_Types *)&params[2].m_end,t_params,in_RCX);
    local_30 = local_50.
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = local_50.
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (local_50.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_50.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_30 = (pointer)0x0;
      local_38 = (pointer)0x0;
    }
    (*(code *)pBVar1)(this);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_50);
    _Var3._M_pi = extraout_RDX_00;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const auto [is_a_match, needs_conversions] = call_match_internal(params, t_conversions);
        if (is_a_match) {
          if (needs_conversions) {
            return m_f(Function_Params{m_param_types.convert(params, t_conversions)});
          } else {
            return m_f(params);
          }
        } else {
          throw exception::guard_error();
        }
      }